

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateDirectFieldStore(Lowerer *this,Instr *instrStFld,PropertySymOpnd *propertySymOpnd)

{
  Func *func;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  OpndKind OVar4;
  uint16 uVar5;
  RegOpnd *baseOpnd;
  undefined4 *puVar6;
  IndirOpnd *opndDst;
  MemRefOpnd *opndDst_00;
  
  func = instrStFld->m_func;
  baseOpnd = (RegOpnd *)LoadSlotArrayWithCachedLocalType(this,instrStFld,propertySymOpnd);
  uVar5 = IR::PropertySymOpnd::GetSlotIndex(propertySymOpnd);
  if (uVar5 == 0xffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cb3,"(index != (uint16)-1)","index != (uint16)-1");
    if (!bVar2) goto LAB_005cc2f5;
    *puVar6 = 0;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  OVar4 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar3 == OpndKindReg) {
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar2) {
LAB_005cc2f5:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    opndDst = IR::IndirOpnd::New(baseOpnd,(uint)uVar5 << 3,TyInt64,func,false);
    LowererMD::GenerateWriteBarrierAssign(&this->m_lowererMD,opndDst,instrStFld->m_src1,instrStFld);
    return;
  }
  if (OVar4 != OpndKindMemRef) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1cbd,"(opndSlotArray->IsMemRefOpnd())","opndSlotArray->IsMemRefOpnd()");
    if (!bVar2) goto LAB_005cc2f5;
    *puVar6 = 0;
  }
  OVar3 = IR::Opnd::GetKind((Opnd *)baseOpnd);
  if (OVar3 != OpndKindMemRef) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1ec,"(this->IsMemRefOpnd())","Bad call to AsMemRefOpnd()");
    if (!bVar2) goto LAB_005cc2f5;
    *puVar6 = 0;
  }
  opndDst_00 = IR::MemRefOpnd::New(&(baseOpnd->m_sym->super_Sym)._vptr_Sym + uVar5,TyInt64,func,
                                   AddrOpndKindDynamicMisc);
  LowererMD::GenerateWriteBarrierAssign(&this->m_lowererMD,opndDst_00,instrStFld->m_src1,instrStFld)
  ;
  return;
}

Assistant:

void
Lowerer::GenerateDirectFieldStore(IR::Instr* instrStFld, IR::PropertySymOpnd* propertySymOpnd)
{
    Func* func = instrStFld->m_func;

    IR::Opnd *opndSlotArray = this->LoadSlotArrayWithCachedLocalType(instrStFld, propertySymOpnd);

    // Store the value to the slot, getting the slot index from the cache.
    uint16 index = propertySymOpnd->GetSlotIndex();
    AssertOrFailFast(index != (uint16)-1);

#if defined(RECYCLER_WRITE_BARRIER_JIT) && (defined(_M_IX86) || defined(_M_AMD64))
    if (opndSlotArray->IsRegOpnd())
    {
        IR::IndirOpnd * opndDst = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, func);
        this->GetLowererMD()->GenerateWriteBarrierAssign(opndDst, instrStFld->GetSrc1(), instrStFld);
    }
    else
    {
        Assert(opndSlotArray->IsMemRefOpnd());
        IR::MemRefOpnd * opndDst = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, func);
        this->GetLowererMD()->GenerateWriteBarrierAssign(opndDst, instrStFld->GetSrc1(), instrStFld);
    }
#else
    IR::Opnd *opnd;

    if (opndSlotArray->IsRegOpnd())
    {
        opnd = IR::IndirOpnd::New(opndSlotArray->AsRegOpnd(), index * sizeof(Js::Var), TyMachReg, func);
    }
    else
    {
        opnd = IR::MemRefOpnd::New((char*)opndSlotArray->AsMemRefOpnd()->GetMemLoc() + (index * sizeof(Js::Var)), TyMachReg, func);
    }

    this->InsertMove(opnd, instrStFld->GetSrc1(), instrStFld);
#endif
}